

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall libcellml::Model::hasUnresolvedImports(Model *this)

{
  ulong uVar1;
  element_type *peVar2;
  bool bVar3;
  element_type *peVar4;
  element_type *peVar5;
  size_t sVar6;
  element_type *peVar7;
  byte local_81;
  byte local_61;
  shared_ptr<libcellml::Component> local_58;
  ulong local_48;
  size_t index_1;
  element_type *local_20;
  size_t index;
  Model *pMStack_10;
  bool unresolvedImports;
  Model *this_local;
  
  index._7_1_ = 0;
  local_20 = (element_type *)0x0;
  pMStack_10 = this;
  while( true ) {
    peVar2 = local_20;
    peVar4 = (element_type *)unitsCount(this);
    local_61 = 0;
    if (peVar2 < peVar4) {
      local_61 = index._7_1_ ^ 0xff;
    }
    if ((local_61 & 1) == 0) break;
    units((Model *)&stack0xffffffffffffffd0,(size_t)this);
    peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&stack0xffffffffffffffd0);
    bVar3 = ImportedEntity::isResolved(&peVar5->super_ImportedEntity);
    index._7_1_ = (bVar3 ^ 0xffU) & 1;
    std::shared_ptr<libcellml::Units>::~shared_ptr
              ((shared_ptr<libcellml::Units> *)&stack0xffffffffffffffd0);
    local_20 = (element_type *)
               ((long)&(local_20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                       super_Entity._vptr_Entity + 1);
  }
  local_48 = 0;
  while( true ) {
    uVar1 = local_48;
    sVar6 = ComponentEntity::componentCount(&this->super_ComponentEntity);
    local_81 = 0;
    if (uVar1 < sVar6) {
      local_81 = index._7_1_ ^ 0xff;
    }
    if ((local_81 & 1) == 0) break;
    ComponentEntity::component((ComponentEntity *)&local_58,(size_t)this);
    peVar7 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_58);
    bVar3 = ImportedEntity::isResolved(&peVar7->super_ImportedEntity);
    index._7_1_ = (bVar3 ^ 0xffU) & 1;
    std::shared_ptr<libcellml::Component>::~shared_ptr(&local_58);
    local_48 = local_48 + 1;
  }
  return (bool)(index._7_1_ & 1);
}

Assistant:

bool Model::hasUnresolvedImports() const
{
    bool unresolvedImports = false;
    for (size_t index = 0; (index < unitsCount()) && !unresolvedImports; ++index) {
        unresolvedImports = !units(index)->isResolved();
    }
    for (size_t index = 0; (index < componentCount()) && !unresolvedImports; ++index) {
        unresolvedImports = !component(index)->isResolved();
    }

    return unresolvedImports;
}